

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,bool,std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  bool bVar1;
  idx_t iVar2;
  size_type sVar3;
  Vector *result_00;
  list_entry_t *this;
  UnifiedVectorFormat *in_RDX;
  ulong in_RSI;
  Vector *in_RDI;
  pair<const_bool,_unsigned_long> *entry;
  iterator __end0;
  iterator __begin0;
  unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
  *__range3;
  list_entry_t *list_entry;
  HistogramAggState<bool,_std::unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>_>
  *state_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  list_entry_t *list_entries;
  Vector *child_elements;
  HistogramAggState<bool,_std::unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>_>
  *state;
  idx_t i;
  idx_t new_entries;
  idx_t old_len;
  HistogramAggState<bool,_std::unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>_>
  **states;
  UnifiedVectorFormat sdata;
  unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
  *this_00;
  unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
  *in_stack_fffffffffffffef0;
  _Node_iterator_base<std::pair<const_bool,_unsigned_long>,_false> local_e8;
  _Node_iterator_base<std::pair<const_bool,_unsigned_long>,_false> local_e0;
  __node_base_ptr local_d8;
  list_entry_t *local_d0;
  __buckets_ptr local_c8;
  UnifiedVectorFormat *local_c0;
  UnifiedVectorFormat *local_b8;
  ulong local_b0;
  list_entry_t *local_a8;
  Vector *local_a0;
  HistogramAggState<bool,_std::unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>_>
  *local_98;
  UnifiedVectorFormat *local_90;
  long local_88;
  ulong local_80;
  unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
  *local_78;
  SelectionVector *local_60 [9];
  UnifiedVectorFormat *local_18;
  ulong local_10;
  Vector *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_60);
  duckdb::Vector::ToUnifiedFormat(local_10,local_18);
  local_78 = (unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
              *)UnifiedVectorFormat::
                GetData<duckdb::HistogramAggState<bool,std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>*>
                          ((UnifiedVectorFormat *)local_60);
  local_80 = duckdb::ListVector::GetListSize(local_8);
  local_88 = 0;
  for (local_90 = (UnifiedVectorFormat *)0x0; local_90 < local_18; local_90 = local_90 + 1) {
    in_stack_fffffffffffffef0 = local_78;
    iVar2 = SelectionVector::get_index(local_60[0],(idx_t)local_90);
    local_98 = (HistogramAggState<bool,_std::unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>_>
                *)(&(in_stack_fffffffffffffef0->_M_h)._M_buckets)[iVar2];
    if (local_98->hist !=
        (unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
         *)0x0) {
      sVar3 = std::
              unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
              ::size((unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
                      *)0xd8c1c9);
      local_88 = sVar3 + local_88;
    }
  }
  duckdb::ListVector::Reserve(local_8,local_80 + local_88);
  result_00 = (Vector *)duckdb::ListVector::GetEntry(local_8);
  local_a0 = result_00;
  this = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xd8c242);
  local_b0 = local_80;
  local_a8 = this;
  for (local_b8 = (UnifiedVectorFormat *)0x0; local_b8 < local_18; local_b8 = local_b8 + 1) {
    local_c0 = local_b8;
    this_00 = local_78;
    iVar2 = SelectionVector::get_index(local_60[0],(idx_t)local_b8);
    local_c8 = (&(this_00->_M_h)._M_buckets)[iVar2];
    local_d0 = local_a8 + (long)local_c0;
    local_d0->offset = local_b0;
    if (*local_c8 == (__node_base_ptr)0x0) {
      local_d0->length = 0;
    }
    else {
      local_d8 = *local_c8;
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
           ::begin(this_00);
      local_e8._M_cur =
           (__node_type *)
           std::
           unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
           ::end(this_00);
      while (bVar1 = std::__detail::operator!=(&local_e0,&local_e8), bVar1) {
        std::__detail::_Node_iterator<std::pair<const_bool,_unsigned_long>,_false,_false>::operator*
                  ((_Node_iterator<std::pair<const_bool,_unsigned_long>,_false,_false> *)0xd8c344);
        FinalizeValueFunctor::HistogramFinalize<bool>
                  (SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0),result_00,(idx_t)this);
        local_b0 = local_b0 + 1;
        std::__detail::_Node_iterator<std::pair<const_bool,_unsigned_long>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_bool,_unsigned_long>,_false,_false> *)this);
      }
      local_d0->length = local_b0 - local_d0->offset;
    }
  }
  duckdb::ListVector::SetListSize(local_8,local_b0);
  duckdb::Vector::Verify((ulong)local_8);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)this);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}